

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint8_t uVar10;
  CordRepBtree *pCVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  undefined8 uVar15;
  CordRep **ppCVar16;
  ulong uVar17;
  long lVar18;
  OpResult OVar19;
  
  bVar2 = (this->super_CordRep).storage[2];
  bVar3 = (this->super_CordRep).storage[1];
  if ((ulong)bVar2 - (ulong)bVar3 < 6) {
    uVar15 = 0;
    pCVar11 = this;
    if (!owned) {
      sVar4 = (this->super_CordRep).length;
      pCVar11 = (CordRepBtree *)operator_new(0x40);
      (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
      (pCVar11->super_CordRep).length = sVar4;
      uVar15 = *(undefined8 *)((long)this->edges_ + 4);
      uVar6 = *(undefined8 *)((long)this->edges_ + 0xc);
      uVar7 = *(undefined8 *)((long)this->edges_ + 0x14);
      uVar8 = *(undefined8 *)((long)this->edges_ + 0x1c);
      uVar9 = *(undefined8 *)((long)this->edges_ + 0x24);
      *(undefined8 *)&(pCVar11->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
      *(undefined8 *)((long)pCVar11->edges_ + 4) = uVar15;
      *(undefined8 *)((long)pCVar11->edges_ + 0xc) = uVar6;
      *(undefined8 *)((long)pCVar11->edges_ + 0x14) = uVar7;
      *(undefined8 *)((long)pCVar11->edges_ + 0x1c) = uVar8;
      *(undefined8 *)((long)pCVar11->edges_ + 0x24) = uVar9;
      *(undefined4 *)((long)pCVar11->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
      uVar15 = 1;
      if (bVar3 != bVar2) {
        lVar18 = (ulong)bVar3 << 3;
        do {
          lVar5 = *(long *)((long)this->edges_ + lVar18);
          if (lVar5 == 0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          piVar1 = (int *)(lVar5 + 8);
          *piVar1 = *piVar1 + 2;
          UNLOCK();
          lVar18 = lVar18 + 8;
        } while ((ulong)bVar2 * 8 != lVar18);
      }
    }
    bVar2 = (pCVar11->super_CordRep).storage[1];
    uVar12 = (ulong)bVar2;
    bVar3 = (pCVar11->super_CordRep).storage[2];
    uVar13 = (uint)bVar3;
    if (uVar12 != 0) {
      uVar14 = bVar3 - uVar12;
      (pCVar11->super_CordRep).storage[1] = '\0';
      (pCVar11->super_CordRep).storage[2] = (uint8_t)uVar14;
      if (6 < uVar14) {
        __assert_fail("new_end <= kMaxCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x2e3,"void absl::cord_internal::CordRepBtree::AlignBegin()");
      }
      if (bVar3 != bVar2) {
        ppCVar16 = pCVar11->edges_;
        uVar17 = uVar14;
        do {
          *ppCVar16 = ppCVar16[uVar12];
          ppCVar16 = ppCVar16 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      uVar13 = (uint)uVar14;
    }
    (pCVar11->super_CordRep).storage[2] = (char)uVar13 + '\x01';
    pCVar11->edges_[uVar13 & 0xff] = edge;
    (pCVar11->super_CordRep).length = (pCVar11->super_CordRep).length + delta;
  }
  else {
    pCVar11 = (CordRepBtree *)operator_new(0x40);
    (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    if (edge->tag == '\x03') {
      uVar10 = edge->storage[0] + '\x01';
    }
    else {
      uVar10 = '\0';
    }
    (pCVar11->super_CordRep).length = edge->length;
    (pCVar11->super_CordRep).tag = '\x03';
    (pCVar11->super_CordRep).storage[0] = uVar10;
    (pCVar11->super_CordRep).storage[1] = '\0';
    (pCVar11->super_CordRep).storage[2] = '\x01';
    pCVar11->edges_[0] = edge;
    uVar15 = 2;
  }
  OVar19._8_8_ = uVar15;
  OVar19.tree = pCVar11;
  return OVar19;
}

Assistant:

inline OpResult CordRepBtree::AddEdge(bool owned, CordRep* edge, size_t delta) {
  if (size() >= kMaxCapacity) return {New(edge), kPopped};
  OpResult result = ToOpResult(owned);
  result.tree->Add<edge_type>(edge);
  result.tree->length += delta;
  return result;
}